

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O1

GenericVec4
deqp::gles31::Functional::anon_unknown_1::mapToFormatColorUnits
          (TextureFormat *texFormat,Vec4 *normalizedRange)

{
  int i;
  TextureChannelClass TVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  GenericVec4 GVar5;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  TextureFormatInfo texFormatInfo;
  ulong local_78;
  ulong uStack_70;
  float local_68 [6];
  TextureFormatInfo local_50;
  
  tcu::getTextureFormatInfo(&local_50,texFormat);
  TVar1 = tcu::getTextureChannelClass(texFormat->type);
  switch(TVar1) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    local_68[0] = 0.0;
    local_68[1] = 0.0;
    local_68[2] = 0.0;
    local_68[3] = 0.0;
    lVar2 = 0;
    do {
      local_68[lVar2] = normalizedRange->m_data[lVar2] + normalizedRange->m_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    local_78 = 0;
    uStack_70 = 0;
    lVar2 = 0;
    do {
      *(float *)((long)&local_78 + lVar2 * 4) = local_68[lVar2] + -1.0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    local_78._0_4_ = normalizedRange->m_data[0];
    uVar3 = (ulong)(uint)normalizedRange->m_data[1];
    uStack_70._0_4_ = normalizedRange->m_data[2];
    uVar4 = (ulong)(uint)normalizedRange->m_data[3];
    goto LAB_0151f100;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    local_68[0] = 0.0;
    local_68[1] = 0.0;
    local_68[2] = 0.0;
    local_68[3] = 0.0;
    lVar2 = 0;
    do {
      local_68[lVar2] =
           (1.0 - normalizedRange->m_data[lVar2]) * local_50.valueMin.m_data[lVar2] +
           normalizedRange->m_data[lVar2] * local_50.valueMax.m_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    local_78 = 0;
    uStack_70 = 0;
    lVar2 = 0;
    do {
      *(int *)((long)&local_78 + lVar2 * 4) = (int)local_68[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    local_68[0] = 0.0;
    local_68[1] = 0.0;
    local_68[2] = 0.0;
    local_68[3] = 0.0;
    lVar2 = 0;
    do {
      local_68[lVar2] =
           (1.0 - normalizedRange->m_data[lVar2]) * local_50.valueMin.m_data[lVar2] +
           normalizedRange->m_data[lVar2] * local_50.valueMax.m_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    local_78 = 0;
    uStack_70 = 0;
    lVar2 = 0;
    do {
      *(int *)((long)&local_78 + lVar2 * 4) = (int)(long)local_68[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    local_68[0] = 0.0;
    local_68[1] = 0.0;
    local_68[2] = 0.0;
    local_68[3] = 0.0;
    lVar2 = 0;
    do {
      local_68[lVar2] = normalizedRange->m_data[lVar2] * local_50.valueMax.m_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    local_78 = 0;
    uStack_70 = 0;
    lVar2 = 0;
    do {
      *(float *)((long)&local_78 + lVar2 * 4) = local_50.valueMin.m_data[lVar2] + local_68[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  default:
    local_78._0_4_ = 0.0;
    uVar3 = 0;
    uStack_70._0_4_ = 0.0;
    uVar4 = 0;
    goto LAB_0151f100;
  }
  uVar3 = local_78 >> 0x20;
  uVar4 = uStack_70 >> 0x20;
LAB_0151f100:
  GVar5.v._0_8_ = (ulong)(uint)(float)local_78 | uVar3 << 0x20;
  GVar5.v._8_8_ = (ulong)(uint)(float)uStack_70 | uVar4 << 0x20;
  return (GenericVec4)GVar5.v;
}

Assistant:

rr::GenericVec4 mapToFormatColorUnits (const tcu::TextureFormat& texFormat, const tcu::Vec4& normalizedRange)
{
	const tcu::TextureFormatInfo texFormatInfo = tcu::getTextureFormatInfo(texFormat);

	switch (tcu::getTextureChannelClass(texFormat.type))
	{
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:		return rr::GenericVec4(normalizedRange);
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:		return rr::GenericVec4(normalizedRange * 2.0f - 1.0f);
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:			return rr::GenericVec4(texFormatInfo.valueMin + normalizedRange * texFormatInfo.valueMax);
		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:			return rr::GenericVec4(tcu::mix(texFormatInfo.valueMin, texFormatInfo.valueMax, normalizedRange).cast<deInt32>());
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:			return rr::GenericVec4(tcu::mix(texFormatInfo.valueMin, texFormatInfo.valueMax, normalizedRange).cast<deUint32>());

		default:
			DE_ASSERT(false);
			return rr::GenericVec4();
	}
}